

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int32 ngram_prob(ngram_model_t *model,char **words,int32 n)

{
  int32 iVar1;
  uint local_38;
  uint32 i;
  int32 wid;
  int32 prob;
  int32 nused;
  int32 *ctx_id;
  char **ppcStack_18;
  int32 n_local;
  char **words_local;
  ngram_model_t *model_local;
  
  ctx_id._4_4_ = n;
  ppcStack_18 = words;
  words_local = (char **)model;
  _prob = (int32 *)__ckd_calloc__((long)(n + -1),4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                  ,0x20d);
  for (local_38 = 1; local_38 < ctx_id._4_4_; local_38 = local_38 + 1) {
    iVar1 = ngram_wid((ngram_model_t *)words_local,ppcStack_18[local_38]);
    _prob[local_38 - 1] = iVar1;
  }
  iVar1 = ngram_wid((ngram_model_t *)words_local,*ppcStack_18);
  iVar1 = ngram_ng_prob((ngram_model_t *)words_local,iVar1,_prob,ctx_id._4_4_ - 1,&wid);
  ckd_free(_prob);
  return iVar1;
}

Assistant:

int32
ngram_prob(ngram_model_t * model, const char* const *words, int32 n)
{
    int32 *ctx_id;
    int32 nused;
    int32 prob;
    int32 wid;
    uint32 i;

    ctx_id = (int32 *) ckd_calloc(n - 1, sizeof(*ctx_id));
    for (i = 1; i < (uint32) n; ++i)
        ctx_id[i - 1] = ngram_wid(model, words[i]);

    wid = ngram_wid(model, *words);
    prob = ngram_ng_prob(model, wid, ctx_id, n - 1, &nused);
    ckd_free(ctx_id);

    return prob;
}